

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotation_angles.hpp
# Opt level: O2

Matrix<float,_3,_1,_0,_3,_1>
eos::fitting::tait_bryan_angles<float>
          (Matrix<float,_3,_3,_0,_3,_3> *rotation_matrix,Index axis_0,Index axis_1,Index axis_2)

{
  float fVar1;
  Matrix<float,_3,_1,_0,_3,_1> MVar4;
  float local_54;
  Matrix<float,_3,_3,_0,_3,_3> *local_50;
  Matrix<float,_3,_3,_0,_3,_3> *local_48 [2];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sign_op<float,_false,_false>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
  local_38;
  ulong uVar2;
  float fVar3;
  
  MVar4 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::eulerAngles
                    ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)rotation_matrix,axis_0,
                     axis_1,axis_2);
  fVar3 = MVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2];
  fVar1 = ABS((rotation_matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).
              m_storage.m_data.array[1]);
  uVar2 = (ulong)(uint)fVar1;
  if (1.5707964 < fVar1) {
    local_54 = 3.1415927;
    local_48[0] = rotation_matrix;
    Eigen::operator*(&local_38,&local_54,(StorageBaseType *)local_48);
    local_50 = rotation_matrix;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,3,1,0,3,1>>>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,3,1,0,3,1>>> *)&local_50,
               (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sign_op<float,_false,_false>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>_>
                *)&local_38);
    fVar1 = -(rotation_matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).
             m_storage.m_data.array[1];
    uVar2 = CONCAT44(0x80000000,fVar1);
    (rotation_matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
    array[1] = fVar1;
  }
  MVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       fVar3;
  MVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (float)(int)uVar2;
  MVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (float)(int)(uVar2 >> 0x20);
  return (Matrix<float,_3,_1,_0,_3,_1>)
         MVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array;
}

Assistant:

inline Eigen::Matrix<T, 3, 1> tait_bryan_angles(Eigen::Matrix<T, 3, 3> rotation_matrix, Eigen::Index axis_0,
                                                Eigen::Index axis_1, Eigen::Index axis_2)
{
    Eigen::Matrix<T, 3, 1> euler_angles = rotation_matrix.eulerAngles(axis_0, axis_1, axis_2);
    // Eigen::Matrix3X.eulerAngles() returns the solution where the first axis is constrained from 0 to PI.
    // This is not what we usually want in robotics; we want the other solution (there are two in the general
    // case) where the middle (pitch) axis is constrained to -PI/2 to PI/2. See
    // https://gitlab.com/libeigen/eigen/-/issues/2617#note_1298729055
    if (std::abs(euler_angles(1)) > T(core::pi<T> / 2.0))
    {
        euler_angles.array() -= T(core::pi<T>) * euler_angles.array().sign();
        euler_angles(1) = -euler_angles(1);
    }
    return euler_angles;
}